

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O3

path * ghc::filesystem::canonical(path *__return_storage_ptr__,path *p,error_code *ec)

{
  ulong uVar1;
  pointer pcVar2;
  impl_string_type *piVar3;
  int iVar4;
  size_type sVar5;
  error_category *peVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX;
  _Alloc_hider nhl;
  format fVar9;
  time_t *lwt;
  path target;
  path work;
  path pe;
  file_status sls;
  file_status fs;
  iterator __begin3;
  iterator __end3;
  path local_198;
  error_code *local_178;
  path *local_170;
  path local_168;
  uint local_144;
  path local_140;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_120;
  error_category *local_118;
  path local_110;
  undefined1 *local_f0;
  long local_e8;
  undefined1 local_e0 [16];
  undefined1 local_d0 [16];
  iterator local_c0;
  iterator local_78;
  _Alloc_hider _Var10;
  
  if ((p->_path)._M_string_length == 0) {
    peVar6 = (error_category *)std::_V2::system_category();
    ec->_M_value = 2;
    ec->_M_cat = peVar6;
    (__return_storage_ptr__->_path)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->_path).field_2;
    (__return_storage_ptr__->_path)._M_string_length = 0;
    (__return_storage_ptr__->_path).field_2._M_local_buf[0] = '\0';
    return __return_storage_ptr__;
  }
  sVar5 = path::root_name_length(p);
  uVar1 = (p->_path)._M_string_length;
  if ((sVar5 < uVar1) && (pcVar2 = (p->_path)._M_dataplus._M_p, pcVar2[sVar5] == '/')) {
    local_110._path._M_dataplus._M_p = (pointer)&local_110._path.field_2;
    std::__cxx11::string::_M_construct<char*>((string *)&local_110,pcVar2,pcVar2 + uVar1);
  }
  else {
    absolute(&local_110,p,ec);
  }
  local_140._path._M_dataplus._M_p = (pointer)((long)&local_140 + 0x10);
  local_140._path._M_string_length = 0;
  local_140._path.field_2._M_local_buf[0] = '\0';
  nhl._M_p = (pointer)0x0;
  lwt = (time_t *)0x0;
  detail::status_ex((path *)(local_d0 + 8),(error_code *)&local_110,(file_status *)ec,
                    (uintmax_t *)0x0,(uintmax_t *)0x0,(time_t *)0x0,0);
  if (ec->_M_value == 0) {
    if (local_d0._8_4_ != 1) {
      paVar7 = &local_198._path.field_2;
      local_120 = &(__return_storage_ptr__->_path).field_2;
      local_178 = ec;
      local_170 = __return_storage_ptr__;
      do {
        sVar5 = path::root_name_length(&local_110);
        peVar6 = (error_category *)path::root_name_length(&local_110);
        if (peVar6 < local_110._path._M_string_length) {
          local_118 = (error_category *)
                      (ulong)(local_110._path._M_dataplus._M_p[(long)peVar6] == '/');
          nhl._M_p = local_110._path._M_dataplus._M_p;
        }
        else {
          local_118 = (error_category *)0x0;
        }
        local_140._path._M_string_length = 0;
        *local_140._path._M_dataplus._M_p = '\0';
        local_78._first._M_current = local_110._path._M_dataplus._M_p;
        path::iterator::iterator(&local_c0,&local_110,&local_78._first);
        local_198._path._M_dataplus._M_p =
             local_110._path._M_dataplus._M_p + local_110._path._M_string_length;
        path::iterator::iterator(&local_78,&local_110,(const_iterator *)&local_198);
        local_118 = (error_category *)((long)local_118 + sVar5);
        local_144 = 0;
        __return_storage_ptr__ = local_170;
        while (local_c0._iter._M_current != local_78._iter._M_current) {
          local_f0 = local_e0;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_f0,local_c0._current._path._M_dataplus._M_p,
                     local_c0._current._path._M_dataplus._M_p +
                     local_c0._current._path._M_string_length);
          iVar4 = 5;
          if (local_e8 != 0) {
            local_198._path._M_dataplus._M_p = (pointer)paVar7;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_198,".","");
            local_168._path._M_dataplus._M_p = (pointer)&local_168._path.field_2;
            _Var10._M_p = local_198._path._M_dataplus._M_p;
            std::__cxx11::string::
            _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                      ((string *)&local_168,local_198._path._M_dataplus._M_p,
                       (error_category *)
                       (local_198._path._M_string_length + (long)local_198._path._M_dataplus._M_p));
            fVar9 = (format)_Var10._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_198._path._M_dataplus._M_p != paVar7) {
              operator_delete(local_198._path._M_dataplus._M_p);
            }
            path::postprocess_path_with_format(&local_168,fVar9);
            iVar4 = path::compare((path *)&local_f0,&local_168);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_168._path._M_dataplus._M_p != &local_168._path.field_2) {
              operator_delete(local_168._path._M_dataplus._M_p);
            }
            __return_storage_ptr__ = local_170;
            if (iVar4 != 0) {
              local_198._path._M_dataplus._M_p = (pointer)paVar7;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_198,"..","");
              local_168._path._M_dataplus._M_p = (pointer)&local_168._path.field_2;
              _Var10._M_p = local_198._path._M_dataplus._M_p;
              std::__cxx11::string::
              _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                        ((string *)&local_168,local_198._path._M_dataplus._M_p,
                         (error_category *)
                         (local_198._path._M_string_length + (long)local_198._path._M_dataplus._M_p)
                        );
              fVar9 = (format)_Var10._M_p;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_198._path._M_dataplus._M_p != paVar7) {
                operator_delete(local_198._path._M_dataplus._M_p);
              }
              path::postprocess_path_with_format(&local_168,fVar9);
              iVar4 = path::compare((path *)&local_f0,&local_168);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_168._path._M_dataplus._M_p != &local_168._path.field_2) {
                operator_delete(local_168._path._M_dataplus._M_p);
              }
              if (iVar4 != 0) {
                operator/(&local_168,&local_140,(path *)&local_f0);
                local_198._path._M_dataplus._M_p = (pointer)paVar7;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_198,local_168._path._M_dataplus._M_p,
                           local_168._path._M_dataplus._M_p + local_168._path._M_string_length);
                sVar5 = local_198._path._M_string_length;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_198._path._M_dataplus._M_p != paVar7) {
                  operator_delete(local_198._path._M_dataplus._M_p);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_168._path._M_dataplus._M_p != &local_168._path.field_2) {
                  operator_delete(local_168._path._M_dataplus._M_p);
                }
                if (local_118 < sVar5) {
                  operator/(&local_198,&local_140,(path *)&local_f0);
                  __return_storage_ptr__ = local_170;
                  detail::symlink_status_ex
                            ((path *)local_d0,(error_code *)&local_198,(uintmax_t *)local_178,
                             (uintmax_t *)nhl._M_p,lwt);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_198._path._M_dataplus._M_p != paVar7) {
                    operator_delete(local_198._path._M_dataplus._M_p);
                  }
                  if (local_178->_M_value == 0) {
                    if (local_d0._0_4_ == 4) {
                      operator/(&local_168,&local_140,(path *)&local_f0);
                      read_symlink(&local_198,&local_168,local_178);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_168._path._M_dataplus._M_p != &local_168._path.field_2) {
                        operator_delete(local_168._path._M_dataplus._M_p);
                      }
                      if (local_178->_M_value == 0) {
                        peVar6 = (error_category *)path::root_name_length(&local_198);
                        if ((peVar6 < local_198._path._M_string_length) &&
                           (nhl._M_p = local_198._path._M_dataplus._M_p,
                           local_198._path._M_dataplus._M_p[(long)peVar6] == '/')) {
                          iVar4 = 5;
                          paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                    *)std::__cxx11::string::_M_assign((string *)&local_140);
                        }
                        else {
                          iVar4 = 5;
                          paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                    *)path::operator/=(&local_140,&local_198);
                        }
                      }
                      else {
                        (__return_storage_ptr__->_path)._M_dataplus._M_p = (pointer)local_120;
                        (__return_storage_ptr__->_path)._M_string_length = 0;
                        (__return_storage_ptr__->_path).field_2._M_local_buf[0] = '\0';
                        iVar4 = 1;
                        paVar8 = local_120;
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_198._path._M_dataplus._M_p != paVar7) {
                        operator_delete(local_198._path._M_dataplus._M_p);
                        paVar8 = extraout_RAX;
                      }
                      local_144 = (uint)CONCAT71((int7)((ulong)paVar8 >> 8),1);
                    }
                    else {
                      iVar4 = 0;
                      path::operator/=(&local_140,(path *)&local_f0);
                    }
                  }
                  else {
                    (__return_storage_ptr__->_path)._M_dataplus._M_p = (pointer)local_120;
                    (__return_storage_ptr__->_path)._M_string_length = 0;
                    (__return_storage_ptr__->_path).field_2._M_local_buf[0] = '\0';
                    iVar4 = 1;
                  }
                }
                else {
                  path::operator/=(&local_140,(path *)&local_f0);
                  iVar4 = 5;
                  __return_storage_ptr__ = local_170;
                }
                goto LAB_001adc30;
              }
              path::parent_path(&local_198,&local_140);
              __return_storage_ptr__ = local_170;
              std::__cxx11::string::operator=((string *)&local_140,(string *)&local_198);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_198._path._M_dataplus._M_p != paVar7) {
                operator_delete(local_198._path._M_dataplus._M_p);
              }
            }
            iVar4 = 5;
          }
LAB_001adc30:
          if (local_f0 != local_e0) {
            operator_delete(local_f0);
          }
          if ((iVar4 != 5) && (iVar4 != 0)) goto LAB_001add50;
          path::iterator::operator++(&local_c0);
        }
        iVar4 = 4;
LAB_001add50:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._current._path._M_dataplus._M_p != &local_78._current._path.field_2) {
          operator_delete(local_78._current._path._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0._current._path._M_dataplus._M_p != &local_c0._current._path.field_2) {
          operator_delete(local_c0._current._path._M_dataplus._M_p);
        }
        if (iVar4 != 0) {
          if (iVar4 != 4) goto LAB_001ad842;
          std::__cxx11::string::_M_assign((string *)&local_110);
        }
      } while ((local_144 & 1) != 0);
      peVar6 = (error_category *)std::_V2::system_category();
      local_178->_M_value = 0;
      local_178->_M_cat = peVar6;
      (__return_storage_ptr__->_path)._M_dataplus._M_p = (pointer)local_120;
      paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)((long)&local_140 + 0x10);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_140._path._M_dataplus._M_p == paVar7) {
        local_120->_M_allocated_capacity =
             CONCAT71(local_140._path.field_2._M_allocated_capacity._1_7_,
                      local_140._path.field_2._M_local_buf[0]);
        *(undefined8 *)((long)local_120 + 8) = local_140._path.field_2._8_8_;
      }
      else {
        (__return_storage_ptr__->_path)._M_dataplus._M_p = local_140._path._M_dataplus._M_p;
        (__return_storage_ptr__->_path).field_2._M_allocated_capacity =
             CONCAT71(local_140._path.field_2._M_allocated_capacity._1_7_,
                      local_140._path.field_2._M_local_buf[0]);
      }
      piVar3 = &local_140._path;
      (__return_storage_ptr__->_path)._M_string_length = local_140._path._M_string_length;
      local_140._path._M_dataplus._M_p = (pointer)paVar7;
      goto LAB_001ad838;
    }
    peVar6 = (error_category *)std::_V2::system_category();
    ec->_M_value = 2;
    ec->_M_cat = peVar6;
  }
  paVar7 = &(__return_storage_ptr__->_path).field_2;
  (__return_storage_ptr__->_path)._M_dataplus._M_p = (pointer)paVar7;
  piVar3 = &__return_storage_ptr__->_path;
LAB_001ad838:
  piVar3->_M_string_length = 0;
  paVar7->_M_local_buf[0] = '\0';
LAB_001ad842:
  if (local_140._path._M_dataplus._M_p != (pointer)((long)&local_140 + 0x10)) {
    operator_delete(local_140._path._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._path._M_dataplus._M_p != &local_110._path.field_2) {
    operator_delete(local_110._path._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

GHC_INLINE path canonical(const path& p, std::error_code& ec)
{
    if (p.empty()) {
        ec = detail::make_error_code(detail::portable_error::not_found);
        return path();
    }
    path work = p.is_absolute() ? p : absolute(p, ec);
    path result;

    auto fs = status(work, ec);
    if (ec) {
        return path();
    }
    if (fs.type() == file_type::not_found) {
        ec = detail::make_error_code(detail::portable_error::not_found);
        return path();
    }
    bool redo;
    do {
        auto rootPathLen = work._prefixLength + work.root_name_length() + (work.has_root_directory() ? 1 : 0);
        redo = false;
        result.clear();
        for (auto pe : work) {
            if (pe.empty() || pe == ".") {
                continue;
            }
            else if (pe == "..") {
                result = result.parent_path();
                continue;
            }
            else if ((result / pe).string().length() <= rootPathLen) {
                result /= pe;
                continue;
            }
            auto sls = symlink_status(result / pe, ec);
            if (ec) {
                return path();
            }
            if (is_symlink(sls)) {
                redo = true;
                auto target = read_symlink(result / pe, ec);
                if (ec) {
                    return path();
                }
                if (target.is_absolute()) {
                    result = target;
                    continue;
                }
                else {
                    result /= target;
                    continue;
                }
            }
            else {
                result /= pe;
            }
        }
        work = result;
    } while (redo);
    ec.clear();
    return result;
}